

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void Adam7_getpassvalues(uint *passw,uint *passh,size_t *filter_passstart,size_t *padded_passstart,
                        size_t *passstart,uint w,uint h,uint bpp)

{
  uint local_3c;
  uint i;
  uint w_local;
  size_t *passstart_local;
  size_t *padded_passstart_local;
  size_t *filter_passstart_local;
  uint *passh_local;
  uint *passw_local;
  
  for (i = 0; i != 7; i = i + 1) {
    passw[i] = (((w + ADAM7_DX[i]) - ADAM7_IX[i]) - 1) / ADAM7_DX[i];
    passh[i] = (((h + ADAM7_DY[i]) - ADAM7_IY[i]) - 1) / ADAM7_DY[i];
    if (passw[i] == 0) {
      passh[i] = 0;
    }
    if (passh[i] == 0) {
      passw[i] = 0;
    }
  }
  *passstart = 0;
  *padded_passstart = 0;
  *filter_passstart = 0;
  for (i = 0; i != 7; i = i + 1) {
    if ((passw[i] == 0) || (passh[i] == 0)) {
      local_3c = 0;
    }
    else {
      local_3c = passh[i] * ((passw[i] * bpp + 7 >> 3) + 1);
    }
    filter_passstart[i + 1] = filter_passstart[i] + (ulong)local_3c;
    padded_passstart[i + 1] = padded_passstart[i] + (ulong)(passh[i] * (passw[i] * bpp + 7 >> 3));
    passstart[i + 1] = passstart[i] + (ulong)(passh[i] * passw[i] * bpp + 7 >> 3);
  }
  return;
}

Assistant:

static void Adam7_getpassvalues(unsigned passw[7], unsigned passh[7], size_t filter_passstart[8],
                                size_t padded_passstart[8], size_t passstart[8], unsigned w, unsigned h, unsigned bpp)
{
  /*the passstart values have 8 values: the 8th one indicates the byte after the end of the 7th (= last) pass*/
  unsigned i;

  /*calculate width and height in pixels of each pass*/
  for(i = 0; i != 7; ++i)
  {
    passw[i] = (w + ADAM7_DX[i] - ADAM7_IX[i] - 1) / ADAM7_DX[i];
    passh[i] = (h + ADAM7_DY[i] - ADAM7_IY[i] - 1) / ADAM7_DY[i];
    if(passw[i] == 0) passh[i] = 0;
    if(passh[i] == 0) passw[i] = 0;
  }

  filter_passstart[0] = padded_passstart[0] = passstart[0] = 0;
  for(i = 0; i != 7; ++i)
  {
    /*if passw[i] is 0, it's 0 bytes, not 1 (no filtertype-byte)*/
    filter_passstart[i + 1] = filter_passstart[i]
                            + ((passw[i] && passh[i]) ? passh[i] * (1 + (passw[i] * bpp + 7) / 8) : 0);
    /*bits padded if needed to fill full byte at end of each scanline*/
    padded_passstart[i + 1] = padded_passstart[i] + passh[i] * ((passw[i] * bpp + 7) / 8);
    /*only padded at end of reduced image*/
    passstart[i + 1] = passstart[i] + (passh[i] * passw[i] * bpp + 7) / 8;
  }
}